

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O1

void lws_ssl_info_callback(SSL *ssl,int where,int ret)

{
  int iVar1;
  SSL_CTX *ssl_00;
  lws_context *context;
  lws *wsi;
  lws_ssl_info si;
  int local_28;
  int local_24;
  
  ssl_00 = SSL_get_SSL_CTX((SSL *)ssl);
  context = (lws_context *)SSL_CTX_get_ex_data(ssl_00,openssl_SSL_CTX_private_data_index);
  if (context != (lws_context *)0x0) {
    iVar1 = SSL_get_fd((SSL *)ssl);
    wsi = wsi_from_fd(context,iVar1);
    if ((wsi != (lws *)0x0) && (((wsi->vhost->tls).ssl_info_event_mask & where) != 0)) {
      _local_28 = CONCAT44(ret,where);
      iVar1 = user_callback_handle_rxflow
                        (wsi->protocol->callback,wsi,LWS_CALLBACK_SSL_INFO,wsi->user_space,&local_28
                         ,0);
      if (iVar1 != 0) {
        lws_set_timeout(wsi,PENDING_TIMEOUT_KILLED_BY_SSL_INFO,-1);
      }
    }
  }
  return;
}

Assistant:

void
lws_ssl_info_callback(const SSL *ssl, int where, int ret)
{
	struct lws *wsi;
	struct lws_context *context;
	struct lws_ssl_info si;

#ifndef USE_WOLFSSL
	context = (struct lws_context *)SSL_CTX_get_ex_data(
					SSL_get_SSL_CTX(ssl),
					openssl_SSL_CTX_private_data_index);
#else
	context = (struct lws_context *)SSL_CTX_get_ex_data(
					SSL_get_SSL_CTX((SSL*) ssl),
					openssl_SSL_CTX_private_data_index);
#endif
	if (!context)
		return;
	wsi = wsi_from_fd(context, SSL_get_fd(ssl));
	if (!wsi)
		return;

	if (!(where & wsi->vhost->tls.ssl_info_event_mask))
		return;

	si.where = where;
	si.ret = ret;

	if (user_callback_handle_rxflow(wsi->protocol->callback,
					wsi, LWS_CALLBACK_SSL_INFO,
					wsi->user_space, &si, 0))
		lws_set_timeout(wsi, PENDING_TIMEOUT_KILLED_BY_SSL_INFO, -1);
}